

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeDropTable(Parse *pParse,Table *pTab,int iDb,int isView)

{
  u16 *puVar1;
  int iVar2;
  uint uVar3;
  sqlite3 *db;
  Db *pDVar4;
  char *pcVar5;
  Schema *pSVar6;
  Table *pTable;
  int iVar7;
  int iVar8;
  Vdbe *p;
  Trigger *pTrigger;
  Index *pIVar9;
  ulong uVar10;
  int iVar11;
  Schema **ppSVar12;
  int iTable;
  Parse *pPVar13;
  HashElem *pHVar14;
  
  db = pParse->db;
  p = pParse->pVdbe;
  pDVar4 = db->aDb;
  if (p == (Vdbe *)0x0) {
    p = allocVdbe(pParse);
  }
  pPVar13 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar13 = pParse;
  }
  sqlite3CodeVerifySchema(pParse,iDb);
  pPVar13->writeMask = pPVar13->writeMask | 1 << ((byte)iDb & 0x1f);
  pPVar13->isMultiWrite = pPVar13->isMultiWrite | 1;
  if (pTab->nModuleArg != 0) {
    sqlite3VdbeAddOp3(p,0x99,0,0,0);
  }
  for (pTrigger = sqlite3TriggerList(pParse,pTab); pTrigger != (Trigger *)0x0;
      pTrigger = pTrigger->pNext) {
    sqlite3DropTriggerPtr(pParse,pTrigger);
  }
  if ((pTab->tabFlags & 8) != 0) {
    sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",pDVar4[iDb].zDbSName,
                       pTab->zName);
  }
  sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE tbl_name=%Q and type!=\'trigger\'",
                     pDVar4[iDb].zDbSName);
  if ((isView == 0) && (pTab->nModuleArg == 0)) {
    iVar8 = pTab->tnum;
    iVar7 = 0;
    do {
      iTable = 0;
      if (iVar8 < iVar7) {
        iTable = iVar8;
      }
      if (iVar7 == 0) {
        iTable = iVar8;
      }
      for (pIVar9 = pTab->pIndex; pIVar9 != (Index *)0x0; pIVar9 = pIVar9->pNext) {
        iVar2 = pIVar9->tnum;
        iVar11 = iTable;
        if (iTable < iVar2) {
          iVar11 = iVar2;
        }
        if (iVar2 < iVar7) {
          iTable = iVar11;
        }
        if (iVar7 == 0) {
          iTable = iVar11;
        }
      }
      if (iTable != 0) {
        if (pTab->pSchema == (Schema *)0x0) {
          uVar10 = 0xfff0bdc0;
        }
        else {
          uVar3 = pParse->db->nDb;
          if ((int)uVar3 < 1) {
            uVar10 = 0;
          }
          else {
            ppSVar12 = &pParse->db->aDb->pSchema;
            uVar10 = 0;
            do {
              if (*ppSVar12 == pTab->pSchema) goto LAB_0023ecae;
              uVar10 = uVar10 + 1;
              ppSVar12 = ppSVar12 + 4;
            } while (uVar3 != uVar10);
            uVar10 = (ulong)uVar3;
          }
        }
LAB_0023ecae:
        destroyRootPage(pParse,iTable,(int)uVar10);
        iVar7 = iTable;
      }
    } while (iTable != 0);
  }
  if (pTab->nModuleArg != 0) {
    pcVar5 = pTab->zName;
    iVar8 = sqlite3VdbeAddOp3(p,0x9b,iDb,0,0);
    sqlite3VdbeChangeP4(p,iVar8,pcVar5,0);
  }
  pcVar5 = pTab->zName;
  iVar8 = sqlite3VdbeAddOp3(p,0x8b,iDb,0,0);
  sqlite3VdbeChangeP4(p,iVar8,pcVar5,0);
  sqlite3VdbeAddOp3(pParse->pVdbe,0x66,iDb,1,(pParse->db->aDb[iDb].pSchema)->schema_cookie + 1);
  pSVar6 = db->aDb[iDb].pSchema;
  if ((pSVar6->schemaFlags & 2) != 0) {
    for (pHVar14 = (pSVar6->tblHash).first; pHVar14 != (HashElem *)0x0; pHVar14 = pHVar14->next) {
      pTable = (Table *)pHVar14->data;
      if (pTable->pSelect != (Select *)0x0) {
        sqlite3DeleteColumnNames(db,pTable);
        pTable->aCol = (Column *)0x0;
        pTable->nCol = 0;
      }
    }
    puVar1 = &(db->aDb[iDb].pSchema)->schemaFlags;
    *puVar1 = *puVar1 & 0xfffd;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeDropTable(Parse *pParse, Table *pTab, int iDb, int isView){
  Vdbe *v;
  sqlite3 *db = pParse->db;
  Trigger *pTrigger;
  Db *pDb = &db->aDb[iDb];

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp0(v, OP_VBegin);
  }
#endif

  /* Drop all triggers associated with the table being dropped. Code
  ** is generated to remove entries from sqlite_master and/or
  ** sqlite_temp_master if required.
  */
  pTrigger = sqlite3TriggerList(pParse, pTab);
  while( pTrigger ){
    assert( pTrigger->pSchema==pTab->pSchema || 
        pTrigger->pSchema==db->aDb[1].pSchema );
    sqlite3DropTriggerPtr(pParse, pTrigger);
    pTrigger = pTrigger->pNext;
  }

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* Remove any entries of the sqlite_sequence table associated with
  ** the table being dropped. This is done before the table is dropped
  ** at the btree level, in case the sqlite_sequence table needs to
  ** move as a result of the drop (can happen in auto-vacuum mode).
  */
  if( pTab->tabFlags & TF_Autoincrement ){
    sqlite3NestedParse(pParse,
      "DELETE FROM %Q.sqlite_sequence WHERE name=%Q",
      pDb->zDbSName, pTab->zName
    );
  }
#endif

  /* Drop all SQLITE_MASTER table and index entries that refer to the
  ** table. The program name loops through the master table and deletes
  ** every row that refers to a table of the same name as the one being
  ** dropped. Triggers are handled separately because a trigger can be
  ** created in the temp database that refers to a table in another
  ** database.
  */
  sqlite3NestedParse(pParse, 
      "DELETE FROM %Q.%s WHERE tbl_name=%Q and type!='trigger'",
      pDb->zDbSName, MASTER_NAME, pTab->zName);
  if( !isView && !IsVirtual(pTab) ){
    destroyTable(pParse, pTab);
  }

  /* Remove the table entry from SQLite's internal schema and modify
  ** the schema cookie.
  */
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp4(v, OP_VDestroy, iDb, 0, 0, pTab->zName, 0);
  }
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);
  sqlite3ChangeCookie(pParse, iDb);
  sqliteViewResetAll(db, iDb);
}